

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c++
# Opt level: O1

void __thiscall
kj::_::Debug::Context::logMessage
          (Context *this,LogSeverity severity,char *file,int line,int contextDepth,String *text)

{
  ExceptionCallback *pEVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  size_t sVar4;
  undefined4 in_register_0000000c;
  ulong uVar5;
  undefined4 in_register_00000084;
  char *pcVar6;
  Value v;
  undefined1 local_8d [13];
  undefined8 uStack_80;
  undefined8 *local_78;
  char *local_68;
  String *local_60;
  Value local_58;
  
  pcVar6 = (char *)CONCAT44(in_register_00000084,contextDepth);
  uVar5 = CONCAT44(in_register_0000000c,line);
  if (this->logged == false) {
    local_8d._1_4_ = line;
    local_68 = file;
    local_60 = text;
    ensureInitialized(&local_58,this);
    pEVar1 = (this->super_ExceptionCallback).next;
    local_8d[0] = 10;
    str<char_const(&)[10],kj::String,char>
              ((String *)(local_8d + 5),(kj *)0x1e224f,(char (*) [10])&local_58.description,
               (String *)local_8d,pcVar6);
    (*pEVar1->_vptr_ExceptionCallback[4])
              (pEVar1,0,local_58.file,(ulong)(uint)local_58.line,0,local_8d + 5);
    uVar3 = uStack_80;
    uVar2 = local_8d._5_8_;
    if (local_8d._5_8_ != 0) {
      local_8d._5_8_ = 0;
      uStack_80 = 0;
      (**(code **)*local_78)(local_78,uVar2,1,uVar3,uVar3,0);
    }
    sVar4 = local_58.description.content.size_;
    pcVar6 = local_58.description.content.ptr;
    this->logged = true;
    if (local_58.description.content.ptr != (char *)0x0) {
      local_58.description.content.ptr = (char *)0x0;
      local_58.description.content.size_ = 0;
      (*(code *)**(undefined8 **)local_58.description.content.disposer)
                (local_58.description.content.disposer,pcVar6,1,sVar4,sVar4,0);
    }
    uVar5 = (ulong)(uint)local_8d._1_4_;
    file = local_68;
    text = local_60;
  }
  pEVar1 = (this->super_ExceptionCallback).next;
  (*pEVar1->_vptr_ExceptionCallback[4])
            (pEVar1,(ulong)severity,file,uVar5,(ulong)(contextDepth + 1),text);
  return;
}

Assistant:

void Debug::Context::logMessage(LogSeverity severity, const char* file, int line, int contextDepth,
                                String&& text) {
  if (!logged) {
    Value v = ensureInitialized();
    next.logMessage(LogSeverity::INFO, v.file, v.line, 0,
                    str("context: ", mv(v.description), '\n'));
    logged = true;
  }

  next.logMessage(severity, file, line, contextDepth + 1, mv(text));
}